

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_infohashes.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::sample_infohashes_observer::reply(sample_infohashes_observer *this,msg *m)

{
  observer_flags_t *poVar1;
  uint uVar2;
  protocol_descriptor *ppVar3;
  sample_infohashes *this_00;
  pointer __dest;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong uVar8;
  dht_observer *pdVar9;
  ulong uVar10;
  char *pcVar11;
  char **in;
  long lVar12;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> v;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  nodes;
  bdecode_node samples;
  _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_148;
  _Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_128;
  bdecode_node id;
  bdecode_node r;
  digest32<160L> local_84;
  bdecode_node n;
  
  key_01._M_str = "r";
  key_01._M_len = 1;
  bdecode_node::dict_find_dict(&r,m->message,key_01);
  bVar4 = bdecode_node::operator_cast_to_bool(&r);
  if (!bVar4) {
    pdVar9 = observer::get_observer((observer *)this);
    (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
              (pdVar9,4,"[%u] missing response dict",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    observer::timeout((observer *)this);
    goto LAB_0036ed89;
  }
  nodes.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nodes.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar3 = ((this->super_traversal_observer).super_observer.m_algorithm.
            super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_node->m_protocol;
  uVar2 = (ppVar3->protocol).super_udp.family_;
  in = (char **)ppVar3->nodes_key;
  sVar6 = strlen((char *)in);
  key_02._M_str = (char *)in;
  key_02._M_len = sVar6;
  bdecode_node::dict_find_string(&n,&r,key_02);
  bVar4 = bdecode_node::operator_cast_to_bool(&n);
  if (bVar4) {
    pbVar7 = (pointer)bdecode_node::string_ptr(&n);
    samples.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar7;
    iVar5 = bdecode_node::string_length(&n);
    lVar12 = 0x1a;
    if (uVar2 == 10) {
      lVar12 = 0x26;
    }
    while (lVar12 <= (long)((long)pbVar7 +
                           ((long)iVar5 -
                           (long)samples.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start))) {
      read_node_endpoint<char_const*&>
                ((node_endpoint *)&id,(dht *)(ulong)uVar2,(udp)(int)&samples,in);
      ::std::
      vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
      ::
      emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
                ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                  *)&nodes,(digest32<160L> *)&id,
                 (basic_endpoint<boost::asio::ip::udp> *)
                 ((long)&id.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
  }
  key_03._M_str = "id";
  key_03._M_len = 2;
  bdecode_node::dict_find_string(&id,&r,key_03);
  bVar4 = bdecode_node::operator_cast_to_bool(&id);
  if (bVar4) {
    iVar5 = bdecode_node::string_length(&id);
    if (iVar5 != 0x14) goto LAB_0036ed33;
    key._M_str = "interval";
    key._M_len = 8;
    uVar8 = bdecode_node::dict_find_int_value(&r,key,-1);
    if (uVar8 < 0x5461) {
      key_00._M_str = "num";
      key_00._M_len = 3;
      uVar10 = bdecode_node::dict_find_int_value(&r,key_00,-1);
      if (uVar10 >> 0x1f == 0) {
        key_04._M_str = "samples";
        key_04._M_len = 7;
        bdecode_node::dict_find_string(&samples,&r,key_04);
        bVar4 = bdecode_node::operator_cast_to_bool(&samples);
        if (bVar4) {
          iVar5 = bdecode_node::string_length(&samples);
          if (iVar5 % 0x14 != 0) goto LAB_0036ee40;
          iVar5 = bdecode_node::string_length(&samples);
          ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          vector(&v,(long)(iVar5 / 0x14),(allocator_type *)&local_84);
          __dest = v.
                   super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar11 = bdecode_node::string_ptr(&samples);
          memcpy(__dest,pcVar11,
                 (long)v.
                       super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v.
                       super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          this_00 = (sample_infohashes *)
                    (this->super_traversal_observer).super_observer.m_algorithm.
                    super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          pcVar11 = bdecode_node::string_ptr(&id);
          digest32<160L>::digest32(&local_84,pcVar11);
          local_128._M_impl.super__Vector_impl_data._M_start =
               v.
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_128._M_impl.super__Vector_impl_data._M_finish =
               v.
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_128._M_impl.super__Vector_impl_data._M_end_of_storage =
               v.
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          v.
          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          v.
          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          v.
          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148._M_impl.super__Vector_impl_data._M_start =
               nodes.
               super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_148._M_impl.super__Vector_impl_data._M_finish =
               nodes.
               super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_148._M_impl.super__Vector_impl_data._M_end_of_storage =
               nodes.
               super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          nodes.
          super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          nodes.
          super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          nodes.
          super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sample_infohashes::got_samples
                    (this_00,&local_84,(time_duration)(uVar8 * 1000000000),(int)uVar10,
                     (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      *)&local_128,
                     (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                      *)&local_148);
          ::std::
          _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          ::~_Vector_base(&local_148);
          ::std::
          _Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          ~_Vector_base(&local_128);
          ::std::
          _Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          ~_Vector_base(&v.
                         super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       );
        }
        else {
LAB_0036ee40:
          pdVar9 = observer::get_observer((observer *)this);
          (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar9,4,"[%u] wrong or missing samples value",
                     (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                             super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_id);
          observer::timeout((observer *)this);
        }
        traversal_observer::reply(&this->super_traversal_observer,m);
        poVar1 = &(this->super_traversal_observer).super_observer.flags;
        poVar1->m_val = poVar1->m_val | 0x80;
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&samples);
      }
      else {
        pdVar9 = observer::get_observer((observer *)this);
        (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar9,4,"[%u] wrong or missing num value",
                   (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                           super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_id);
        observer::timeout((observer *)this);
      }
    }
    else {
      pdVar9 = observer::get_observer((observer *)this);
      (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                (pdVar9,4,"[%u] wrong or missing interval value",
                 (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                         super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_id);
      observer::timeout((observer *)this);
    }
  }
  else {
LAB_0036ed33:
    pdVar9 = observer::get_observer((observer *)this);
    (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
              (pdVar9,4,"[%u] wrong or missing id value",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    observer::timeout((observer *)this);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&id);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&n);
  ::std::
  _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::~_Vector_base(&nodes.
                   super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 );
LAB_0036ed89:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&r);
  return;
}

Assistant:

void sample_infohashes_observer::reply(msg const& m)
{
	bdecode_node r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	// look for nodes
	std::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
	udp const protocol = algorithm()->get_node().protocol();
	int const protocol_size = int(aux::address_size(protocol));
	char const* nodes_key = algorithm()->get_node().protocol_nodes_key();
	bdecode_node const n = r.dict_find_string(nodes_key);
	if (n)
	{
		char const* ptr = n.string_ptr();
		char const* end = ptr + n.string_length();

		while (end - ptr >= 20 + protocol_size + 2)
		{
			node_endpoint nep = read_node_endpoint(protocol, ptr);
			nodes.emplace_back(nep.id, nep.ep);
		}
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing id value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const interval = r.dict_find_int_value("interval", -1);
	if (interval < 0 || interval > 21600) // TODO: put constant in a common place
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing interval value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const num = r.dict_find_int_value("num", -1);
	if (num < 0 || num > std::numeric_limits<int>::max())
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing num value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node samples = r.dict_find_string("samples");
	if (samples && (samples.string_length() % 20 == 0))
	{
		std::vector<sha1_hash> v(aux::numeric_cast<std::size_t>(samples.string_length() / 20));
		std::memcpy(v.data(), samples.string_ptr(), v.size() * 20);

		static_cast<sample_infohashes*>(algorithm())->got_samples(
			node_id(id.string_ptr()), seconds(interval), int(num), std::move(v), std::move(nodes));
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing samples value"
			, algorithm()->id());
#endif
		timeout();
	}

	// we deliberately do not call
	traversal_observer::reply(m);
	// this is necessary to play nice with
	// observer::abort(), observer::done() and observer::timeout()
	flags |= flag_done;
}